

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O1

void __thiscall Node::ScanOneMap(Node *this,VariableStruct *MapVar,int skipprefix)

{
  int iVar1;
  pointer pcVar2;
  ostream *this_00;
  long *plVar3;
  VariableStruct NewVar;
  undefined1 local_120 [72];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  pointer local_a0;
  pointer local_90;
  string local_88;
  string local_68;
  string local_48;
  
  iVar1 = this->Type;
  if (iVar1 < 0x1a0) {
    if (((0x3f < iVar1 - 0x110U) ||
        ((0x8200000010080001U >> ((ulong)(iVar1 - 0x110U) & 0x3f) & 1) == 0)) &&
       ((0x3a < iVar1 - 0x157U ||
        ((0x400080000000101U >> ((ulong)(iVar1 - 0x157U) & 0x3f) & 1) == 0)))) {
LAB_0010aff1:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Undefined type ",0xf);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->Type);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"@",1);
      plVar3 = (long *)std::ostream::operator<<((ostream *)this_00,this->lineno);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      goto LAB_0010aec7;
    }
LAB_0010adcc:
    pcVar2 = (this->Tree[1]->TextValue)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (this->Tree[1]->TextValue)._M_string_length);
    VariableStruct::VariableStruct
              ((VariableStruct *)local_120,&local_68,VARTYPE_NONE,VARCLASS_MAP,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    VariableList::Append(Variables,(VariableStruct *)local_120,0);
  }
  else if (iVar1 < 0x1d8) {
    if ((iVar1 == 0x1a0) || (iVar1 == 0x1ba)) goto LAB_0010adcc;
    if (iVar1 != 0x1d3) goto LAB_0010aff1;
    pcVar2 = (this->TextValue)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
    VariableStruct::VariableStruct
              ((VariableStruct *)local_120,&local_48,VARTYPE_NONE,VARCLASS_MAP,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    VariableList::Append(Variables,(VariableStruct *)local_120,0);
  }
  else {
    if (iVar1 != 0x1d8) {
      if (iVar1 != 0x204) {
        if (iVar1 == 0x1f5) {
          if (this->Tree[0] != (Node *)0x0) {
            ScanOneMap(this->Tree[0],MapVar,skipprefix);
          }
          if (this->Tree[1] != (Node *)0x0) {
            ScanOneMap(this->Tree[1],MapVar,skipprefix);
          }
          goto LAB_0010aec7;
        }
        goto LAB_0010aff1;
      }
      goto LAB_0010adcc;
    }
    pcVar2 = (this->Tree[0]->TextValue)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (this->Tree[0]->TextValue)._M_string_length);
    VariableStruct::VariableStruct
              ((VariableStruct *)local_120,&local_88,VARTYPE_NONE,VARCLASS_MAP,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    VariableList::Append(Variables,(VariableStruct *)local_120,0);
  }
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != local_c8) {
    operator_delete(local_d8._M_p,local_c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_120._40_8_ != local_120 + 0x38) {
    operator_delete((void *)local_120._40_8_,local_120._56_8_ + 1);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
LAB_0010aec7:
  if (this->Block[0] != (Node *)0x0) {
    ScanOneMap(this->Block[0],MapVar,skipprefix);
  }
  return;
}

Assistant:

void Node::ScanOneMap(
	VariableStruct* MapVar,	/**< Main map variable */
	int skipprefix
)
{
	switch (Type)
	{
	case BAS_N_LIST:
 
		if (Tree[0] != 0)
		{
			Tree[0]->ScanOneMap(MapVar, skipprefix);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanOneMap(MapVar, skipprefix);
		}
		break;                                                                   
	case BAS_V_NAME:
 
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	case BAS_N_VARTYPE:
	case BAS_S_BYTE:
	case BAS_S_DOUBLE:
	case BAS_S_GFLOAT:
	case BAS_S_HFLOAT:
	case BAS_S_LONG:
	case BAS_S_WORD:
	case BAS_S_INTEGER:
	case BAS_S_REAL:
	case BAS_S_RFA:
	case BAS_S_STRING:
	case BAS_S_DECIMAL:
 
		{
			VariableStruct NewVar(Tree[1]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
// FIXME: This is just to have something here, but it doesn't do
// the right thing yet
	case BAS_V_DEFINEVAR:
 
		{
			VariableStruct NewVar(Tree[0]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	default:
		std::cerr << "Undefined type " << Type << "@" << lineno << std::endl;
		break;
	}
 
	if (Block[0] != 0)
	{
		Block[0]->ScanOneMap(MapVar, skipprefix);
	}
}